

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O2

void signal_handler(int sig)

{
  ostream *poVar1;
  
  g_Terminate = true;
  std::mutex::lock(&g_ReportMutex);
  poVar1 = std::operator<<((ostream *)&std::cout,"SIGINT received, terminating");
  std::endl<char,std::char_traits<char>>(poVar1);
  pthread_mutex_unlock((pthread_mutex_t *)&g_ReportMutex);
  return;
}

Assistant:

void signal_handler(int sig)
{
	(void)sig;

	g_Terminate = true;

	lock_guard<mutex> guard(g_ReportMutex);
	cout << "SIGINT received, terminating" << endl;
}